

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerTestObject.h
# Opt level: O1

bool __thiscall
TrackedObject<51U,_1000U>::TryGetRandomLocation(TrackedObject<51U,_1000U> *this,Location *location)

{
  uint uVar1;
  uint uVar2;
  IRecyclerVisitedObject *pIVar3;
  size_t sVar4;
  RecyclerTestObject *this_00;
  Location *object;
  TrackedObject<51U,_1000U> *pTVar5;
  ulong uVar6;
  
  uVar1 = this->count;
  object = location;
  pTVar5 = this;
  uVar2 = PAL_rand();
  pIVar3 = &this[1].super_RecyclerTestObject.super_IRecyclerVisitedObject +
           (ulong)uVar2 % (ulong)uVar1;
  if (pIVar3 != (IRecyclerVisitedObject *)0x0) {
    location->location = (RecyclerTestObject **)pIVar3;
    location->type = Tagged;
    return true;
  }
  TrackedObject<51u,1000u>::TryGetRandomLocation();
  sVar4 = RecyclerTestObject::walkTrackedByteCount + (ulong)pTVar5->count * 8 + 0x20;
  RecyclerTestObject::walkTrackedByteCount = sVar4;
  if (pTVar5->count != 0) {
    uVar6 = 0;
    do {
      this_00 = Location::Untag((RecyclerTestObject *)
                                (&pTVar5[1].super_RecyclerTestObject.super_IRecyclerVisitedObject)
                                [uVar6]._vptr_IRecyclerVisitedObject);
      RecyclerTestObject::WalkReference(this_00,(RecyclerTestObject *)object);
      uVar6 = uVar6 + 1;
      sVar4 = (size_t)pTVar5->count;
    } while (uVar6 < sVar4);
  }
  return SUB81(sVar4,0);
}

Assistant:

virtual bool TryGetRandomLocation(Location * location) override
    {
        // Get a random slot and construct a Location for it
        *location = Location::Tagged(&references[GetRandomInteger(count)]);

        return true;
    }